

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-base.h
# Opt level: O0

string * __thiscall
mp::BasicSolver::GetSolutionStub_abi_cxx11_(BasicSolver *this,SolverOption *param_2)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x1b8));
  return in_RDI;
}

Assistant:

std::string GetSolutionStub(const SolverOption &) const {
    return solution_stub_;
  }